

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O1

LY_ERR lys_compile_depset_all(ly_ctx *ctx,lys_glob_unres *unres)

{
  lyd_node *plVar1;
  long lVar2;
  LY_ERR LVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((unres->dep_sets).count != 0) {
    uVar4 = 0;
    do {
      plVar1 = (unres->dep_sets).field_2.dnodes[uVar4];
      LVar3 = LY_SUCCESS;
      if (plVar1->flags != 0) {
        uVar5 = 0;
        do {
          lVar2 = *(long *)(plVar1->schema->hash + uVar5 * 8 + -4);
          if ((*(char *)(lVar2 + 0x79) != '\0') &&
             (LVar3 = lys_check_features(*(lysp_module **)(lVar2 + 0x50)), LVar3 != LY_SUCCESS))
          goto LAB_00142ae4;
          uVar5 = uVar5 + 1;
        } while (uVar5 < plVar1->flags);
        LVar3 = LY_SUCCESS;
      }
LAB_00142ae4:
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      LVar3 = lys_compile_depset_r(ctx,(ly_set *)(unres->dep_sets).field_2.dnodes[uVar4],unres);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (unres->dep_sets).count);
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lys_compile_depset_all(struct ly_ctx *ctx, struct lys_glob_unres *unres)
{
    uint32_t i;

    for (i = 0; i < unres->dep_sets.count; ++i) {
        LY_CHECK_RET(lys_compile_depset_check_features(unres->dep_sets.objs[i]));
        LY_CHECK_RET(lys_compile_depset_r(ctx, unres->dep_sets.objs[i], unres));
    }

    return LY_SUCCESS;
}